

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O2

void __thiscall
CStorage::ListDirectory
          (CStorage *this,int Type,char *pPath,FS_LISTDIR_CALLBACK pfnCallback,void *pUser)

{
  char *pcVar1;
  int i;
  int Type_00;
  long in_FS_OFFSET;
  char aBuffer [512];
  char acStack_238 [512];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Type == -1) {
    for (Type_00 = 0; Type_00 < this->m_NumPaths; Type_00 = Type_00 + 1) {
      pcVar1 = GetPath(this,Type_00,pPath,acStack_238,0x200);
      fs_listdir(pcVar1,pfnCallback,Type_00,pUser);
    }
  }
  else if ((-1 < Type) && (Type < this->m_NumPaths)) {
    pcVar1 = GetPath(this,Type,pPath,acStack_238,0x200);
    fs_listdir(pcVar1,pfnCallback,Type,pUser);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

virtual void ListDirectory(int Type, const char *pPath, FS_LISTDIR_CALLBACK pfnCallback, void *pUser)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(Type == TYPE_ALL)
		{
			// list all available directories
			for(int i = 0; i < m_NumPaths; ++i)
				fs_listdir(GetPath(i, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, i, pUser);
		}
		else if(Type >= 0 && Type < m_NumPaths)
		{
			// list wanted directory
			fs_listdir(GetPath(Type, pPath, aBuffer, sizeof(aBuffer)), pfnCallback, Type, pUser);
		}
	}